

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::setExpanded(QToolBarLayout *this,bool exp)

{
  bool bVar1;
  QWidget *pQVar2;
  QMainWindow *this_00;
  QMainWindowLayout *pQVar3;
  uint __sig;
  long in_FS_OFFSET;
  QRect QVar4;
  QSize local_60;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QLayout::parentWidget(&this->super_QLayout);
  pQVar2 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar2->super_QObject)->super_QWidget
  ;
  if ((pQVar2 != (QWidget *)0x0) &&
     (((bool)(this->super_QLayout).super_QLayoutItem.field_0xc != exp ||
      (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)))) {
    (this->super_QLayout).super_QLayoutItem.field_0xc = exp;
    __sig = (uint)exp;
    QAbstractButton::setChecked((QAbstractButton *)this->extension,exp);
    this_00 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                        (*(QObject **)(*(long *)&pQVar2->field_0x8 + 0x10));
    if (this_00 != (QMainWindow *)0x0) {
      if (((pQVar2->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        bVar1 = QMainWindow::isAnimated(this_00);
      }
      else {
        bVar1 = false;
      }
      (this->super_QLayout).super_QLayoutItem.field_0xd = bVar1;
      pQVar3 = qt_mainwindow_layout(this_00);
      if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        QWidget::raise(pQVar2,__sig);
      }
      else {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        QMainWindowLayoutState::indexOf((QList<int> *)&local_58,&pQVar3->layoutState,pQVar2);
        if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
          QVar4 = QMainWindowLayoutState::itemRect(&pQVar3->layoutState,(QList<int> *)&local_58);
          local_60.wd.m_i = (QVar4.x2.m_i.m_i - QVar4.x1.m_i) + 1;
          local_60.ht.m_i = (QVar4.y2.m_i.m_i - QVar4.y1.m_i) + 1;
          layoutActions(this,&local_60);
        }
        QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
      }
      QToolBarAreaLayout::apply
                (&(pQVar3->layoutState).toolBarAreaLayout,
                 (bool)(this->super_QLayout).super_QLayoutItem.field_0xd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::setExpanded(bool exp)
{
    QWidget *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    if (exp == expanded && !tb->isWindow())
        return;

    expanded = exp;
    extension->setChecked(expanded);

    if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget())) {
#if !QT_CONFIG(dockwidget)
        animating = false;
#else
        animating = !tb->isWindow() && win->isAnimated();
#endif
        QMainWindowLayout *layout = qt_mainwindow_layout(win);
        if (expanded) {
            tb->raise();
        } else {
            QList<int> path = layout->layoutState.indexOf(tb);
            if (!path.isEmpty()) {
                QRect rect = layout->layoutState.itemRect(path);
                layoutActions(rect.size());
            }
        }
        layout->layoutState.toolBarAreaLayout.apply(animating);
    }
}